

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall
CTcParser::parse_stm
          (CTcParser *this,int *err,CTPNStmSwitch *enclosing_switch,int compound_use_enclosing_scope
          )

{
  tc_toktyp_t tVar1;
  int iVar2;
  CTcTokFileDesc *pCVar3;
  long lVar4;
  CTcToken *__src;
  CTcSymLabelBase *this_00;
  CTPNStmEnclosing *stm_00;
  CTPNStm *stm_01;
  CTcPrsNode *pCVar5;
  CTPNStmLabel *pCVar6;
  undefined4 in_ECX;
  CTcTokenizer *this_01;
  int *in_RDX;
  CTcParser *in_RSI;
  CTcParser *in_RDI;
  CTcParser *unaff_retaddr;
  int *in_stack_00000010;
  CTcParser *in_stack_00000018;
  CTcPrsNode *expr;
  CTcParser *in_stack_00000028;
  int *in_stack_00000030;
  CTPNStm *stm;
  CTcSymLabel *lbl;
  CTPNStmLabel *label_stm;
  CTPNStmEnclosing *old_enclosing;
  CTcToken tok;
  undefined8 in_stack_ffffffffffffff58;
  CTcTokenizer *in_stack_ffffffffffffff60;
  CTcTokenizer *in_stack_ffffffffffffff78;
  CTPNStmSwitch *in_stack_ffffffffffffff80;
  CTcParser *in_stack_ffffffffffffff88;
  CTcParser *in_stack_ffffffffffffff90;
  CTcParser *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  CTcParser *in_stack_ffffffffffffffa8;
  undefined1 local_50 [36];
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  CTcParser *pCVar7;
  int *in_stack_fffffffffffffff8;
  
  pCVar7 = in_RDI;
  CTcToken::CTcToken((CTcToken *)local_50);
  pCVar3 = CTcTokenizer::get_last_desc(G_tok);
  in_RDI->cur_desc_ = pCVar3;
  lVar4 = CTcTokenizer::get_last_linenum(G_tok);
  in_RDI->cur_linenum_ = lVar4;
LAB_002bafd9:
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2bafe8);
  iVar2 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  this_01 = (CTcTokenizer *)(ulong)(tVar1 - TOKT_EOF);
  switch(this_01) {
  case (CTcTokenizer *)0x0:
    CTcTokenizer::log_error(0x2b22);
    *(undefined4 *)
     &(((CTPNStmSwitchBase *)&in_RSI->ov_op_add_)->super_CTPNStmEnclosing).super_CTPNStm.
      super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 1;
    return (CTPNStm *)(CTPNStmLabel *)0x0;
  default:
    break;
  case (CTcTokenizer *)0x6:
    __src = CTcTokenizer::copycur(in_stack_ffffffffffffff78);
    memcpy(local_50,__src,0x21);
    tVar1 = CTcTokenizer::next(this_01);
    if (tVar1 == TOKT_COLON) {
      this_00 = &add_code_label(in_stack_ffffffffffffff90,(CTcToken *)in_stack_ffffffffffffff88)->
                 super_CTcSymLabelBase;
      pCVar6 = (CTPNStmLabel *)CTcPrsAllocObj::operator_new(0x2bb487);
      CTPNStmLabel::CTPNStmLabel
                ((CTPNStmLabel *)in_RDI,(CTcSymLabel *)this_01,(CTPNStmEnclosing *)pCVar6);
      CTcTokenizer::next(this_01);
      stm_00 = set_enclosing_stm(in_RDI,(CTPNStmEnclosing *)pCVar6);
      stm_01 = parse_stm(in_RSI,in_RDX,(CTPNStmSwitch *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                         in_stack_ffffffffffffffd4);
      set_enclosing_stm(in_RDI,stm_00);
      if (*(int *)&in_RSI->ov_op_add_ != 0) {
        return (CTPNStm *)(CTPNStmLabel *)0x0;
      }
      CTPNStmLabelBase::set_stm(&pCVar6->super_CTPNStmLabelBase,stm_01);
      if (this_00 == (CTcSymLabelBase *)0x0) {
        return (CTPNStm *)pCVar6;
      }
      CTcSymLabelBase::set_stm(this_00,pCVar6);
      return (CTPNStm *)pCVar6;
    }
    CTcTokenizer::unget((CTcTokenizer *)0x2bb58e);
    break;
  case (CTcTokenizer *)0xe:
  case (CTcTokenizer *)0xf:
  case (CTcTokenizer *)0x16:
    CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff60,iVar2);
    CTcTokenizer::next(this_01);
    return (CTPNStm *)(CTPNStmLabel *)0x0;
  case (CTcTokenizer *)0x12:
    goto switchD_002bb00e_caseD_12;
  case (CTcTokenizer *)0x15:
    pCVar6 = (CTPNStmLabel *)
             parse_compound(unaff_retaddr,in_stack_fffffffffffffff8,(int)((ulong)pCVar7 >> 0x20),
                            (int)pCVar7,(CTPNStmSwitch *)in_RSI,(int)((ulong)in_RDX >> 0x20));
    return (CTPNStm *)pCVar6;
  case (CTcTokenizer *)0x28:
    CTcTokenizer::next(this_01);
    return (CTPNStm *)(CTPNStmLabel *)0x0;
  case (CTcTokenizer *)0x4f:
    pCVar6 = (CTPNStmLabel *)parse_if(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    return (CTPNStm *)pCVar6;
  case (CTcTokenizer *)0x50:
    CTcTokenizer::log_error(0x2b24);
    CTcTokenizer::next(this_01);
    return (CTPNStm *)(CTPNStmLabel *)0x0;
  case (CTcTokenizer *)0x51:
    pCVar6 = (CTPNStmLabel *)parse_for((CTcParser *)stm,in_stack_00000030);
    return (CTPNStm *)pCVar6;
  case (CTcTokenizer *)0x52:
    pCVar6 = (CTPNStmLabel *)parse_while(in_stack_ffffffffffffff98,(int *)in_stack_ffffffffffffff90)
    ;
    return (CTPNStm *)pCVar6;
  case (CTcTokenizer *)0x53:
    pCVar6 = (CTPNStmLabel *)parse_do_while(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    return (CTPNStm *)pCVar6;
  case (CTcTokenizer *)0x54:
    pCVar6 = (CTPNStmLabel *)parse_switch(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    return (CTPNStm *)pCVar6;
  case (CTcTokenizer *)0x55:
    if (in_RDX != (int *)0x0) {
      pCVar6 = (CTPNStmLabel *)
               parse_case(in_stack_ffffffffffffff98,(int *)in_stack_ffffffffffffff90,
                          (CTPNStmSwitch *)in_stack_ffffffffffffff88);
      return (CTPNStm *)pCVar6;
    }
    CTcTokenizer::log_error(0x2b25);
    CTcTokenizer::next(this_01);
    parse_expr((CTcParser *)0x2bb38a);
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2bb399);
    if (tVar1 == TOKT_COLON) {
      CTcTokenizer::next(this_01);
    }
    return (CTPNStm *)(CTPNStmLabel *)0x0;
  case (CTcTokenizer *)0x56:
    if (in_RDX != (int *)0x0) {
      pCVar6 = (CTPNStmLabel *)
               parse_default(in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88,
                             in_stack_ffffffffffffff80);
      return (CTPNStm *)pCVar6;
    }
    CTcTokenizer::log_error(0x2b26);
    tVar1 = CTcTokenizer::next(this_01);
    if (tVar1 == TOKT_COLON) {
      CTcTokenizer::next(this_01);
    }
    return (CTPNStm *)(CTPNStmLabel *)0x0;
  case (CTcTokenizer *)0x57:
    pCVar6 = (CTPNStmLabel *)parse_goto(in_stack_ffffffffffffff98,(int *)in_stack_ffffffffffffff90);
    return (CTPNStm *)pCVar6;
  case (CTcTokenizer *)0x58:
    pCVar6 = (CTPNStmLabel *)parse_break(in_stack_ffffffffffffff88,(int *)in_stack_ffffffffffffff80)
    ;
    return (CTPNStm *)pCVar6;
  case (CTcTokenizer *)0x59:
    pCVar6 = (CTPNStmLabel *)
             parse_continue(in_stack_ffffffffffffff88,(int *)in_stack_ffffffffffffff80);
    return (CTPNStm *)pCVar6;
  case (CTcTokenizer *)0x5b:
    pCVar6 = (CTPNStmLabel *)
             parse_return(in_stack_ffffffffffffff98,(int *)in_stack_ffffffffffffff90);
    return (CTPNStm *)pCVar6;
  case (CTcTokenizer *)0x5c:
    create_scope_local_symtab(in_RDI);
    pCVar6 = (CTPNStmLabel *)parse_local(in_stack_00000018,in_stack_00000010);
    return (CTPNStm *)pCVar6;
  case (CTcTokenizer *)0x69:
    pCVar6 = (CTPNStmLabel *)parse_throw(in_stack_ffffffffffffff88,(int *)in_stack_ffffffffffffff80)
    ;
    return (CTPNStm *)pCVar6;
  case (CTcTokenizer *)0x6a:
    pCVar6 = (CTPNStmLabel *)parse_try((CTcParser *)tok._32_8_,(int *)tok.int_val_);
    return (CTPNStm *)pCVar6;
  case (CTcTokenizer *)0x6b:
    CTcTokenizer::log_error(0x2b43);
    tVar1 = CTcTokenizer::next(this_01);
    if ((((tVar1 == TOKT_LPAR) && (tVar1 = CTcTokenizer::next(this_01), tVar1 == TOKT_SYM)) &&
        (tVar1 = CTcTokenizer::next(this_01), tVar1 == TOKT_SYM)) &&
       (tVar1 = CTcTokenizer::next(this_01), tVar1 == TOKT_RPAR)) {
      CTcTokenizer::next(this_01);
    }
    return (CTPNStm *)(CTPNStmLabel *)0x0;
  case (CTcTokenizer *)0x6c:
    CTcTokenizer::log_error(0x2b44);
    CTcTokenizer::next(this_01);
    return (CTPNStm *)(CTPNStmLabel *)0x0;
  case (CTcTokenizer *)0x73:
    pCVar6 = (CTPNStmLabel *)parse_foreach(in_stack_00000028,(int *)expr);
    return (CTPNStm *)pCVar6;
  }
  pCVar5 = parse_expr_or_dstr((CTcParser *)in_stack_ffffffffffffff60,iVar2);
  iVar2 = parse_req_sem();
  if (iVar2 != 0) {
    *(undefined4 *)
     &(((CTPNStmSwitchBase *)&in_RSI->ov_op_add_)->super_CTPNStmEnclosing).super_CTPNStm.
      super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 1;
    return (CTPNStm *)(CTPNStmLabel *)0x0;
  }
  if (pCVar5 != (CTcPrsNode *)0x0) {
    pCVar6 = (CTPNStmLabel *)CTcPrsAllocObj::operator_new(0x2bb5fe);
    CTPNStmExpr::CTPNStmExpr((CTPNStmExpr *)in_stack_ffffffffffffff60,(CTcPrsNode *)pCVar6);
    return (CTPNStm *)pCVar6;
  }
  return (CTPNStm *)(CTPNStmLabel *)0x0;
switchD_002bb00e_caseD_12:
  CTcTokenizer::log_error(0x2b13);
  CTcTokenizer::next(this_01);
  goto LAB_002bafd9;
}

Assistant:

CTPNStm *CTcParser::parse_stm(int *err, CTPNStmSwitch *enclosing_switch,
                              int compound_use_enclosing_scope)
{
    CTcToken tok;

    /* 
     *   remember where the statement starts - when we create the
     *   statement object, it will refer to these values to set its
     *   internal memory of the statement's source file location 
     */
    cur_desc_ = G_tok->get_last_desc();
    cur_linenum_ = G_tok->get_last_linenum();

    /* see what we have */
try_again:
    switch(G_tok->cur())
    {
    case TOKT_EOF:
        /* unexpected end of file - log an error */
        G_tok->log_error(TCERR_EOF_IN_CODE);
        
        /* set the caller's error flag */
        *err = TRUE;

        /* there's no statement to return, obviously */
        return 0;

    case TOKT_DSTR_MID:
    case TOKT_DSTR_END:
    case TOKT_RBRACE:
        /* 
         *   we shouldn't be looking at any of these at the start of a
         *   statement 
         */
        G_tok->log_error_curtok(TCERR_EXPECTED_STMT_START);
        G_tok->next();
        return 0;

    case TOKT_SEM:
        /* 
         *   null statement - this doesn't generate any code; simply skip
         *   the semicolon and keep going 
         */
        G_tok->next();

        /* this doesn't generate any code */
        return 0;

    case TOKT_LOCAL:
        /* if we don't have our own local symbol table, create one */
        create_scope_local_symtab();

        /* parse the local variable definition and return the result */
        return parse_local(err);

    case TOKT_LBRACE:
        /* it's a compound statement */
        return parse_compound(err, TRUE, TRUE,
                              0, compound_use_enclosing_scope);
        
    case TOKT_IF:
        /* parse an if statement */
        return parse_if(err);

    case TOKT_RETURN:
        /* parse a return statement */
        return parse_return(err);

    case TOKT_FOR:
        /* parse a for statement */
        return parse_for(err);

    case TOKT_FOREACH:
        /* parse a foreach statement */
        return parse_foreach(err);

    case TOKT_WHILE:
        /* parse a while statement */
        return parse_while(err);

    case TOKT_DO:
        /* parse a do-while */
        return parse_do_while(err);

    case TOKT_SWITCH:
        /* parse a switch */
        return parse_switch(err);

    case TOKT_GOTO:
        /* parse a 'goto' */
        return parse_goto(err);

    case TOKT_BREAK:
        return parse_break(err);

    case TOKT_CONTINUE:
        return parse_continue(err);

    case TOKT_TRY:
        return parse_try(err);

    case TOKT_THROW:
        return parse_throw(err);

    case TOKT_CATCH:
        /* misplaced 'catch' clause - log an error */
        G_tok->log_error(TCERR_MISPLACED_CATCH);

        /* 
         *   skip the following open paren, class name, variable name, and
         *   closing paren, as long as we find all of these 
         */
        if (G_tok->next() == TOKT_LPAR
            && G_tok->next() == TOKT_SYM
            && G_tok->next() == TOKT_SYM
            && G_tok->next() == TOKT_RPAR)
            G_tok->next();

        /* there's no valid statement to return */
        return 0;

    case TOKT_FINALLY:
        /* misplaced 'finally' clause - log an error */
        G_tok->log_error(TCERR_MISPLACED_FINALLY);

        /* skip the 'finally' keyword, and return failure */
        G_tok->next();
        return 0;

    case TOKT_ELSE:
        /* 
         *   misplaced 'else' clause - log an error, skip the 'else'
         *   keyword, and proceed with what follows 
         */
        G_tok->log_error(TCERR_MISPLACED_ELSE);
        G_tok->next();
        return 0;

    case TOKT_CASE:
        /* 
         *   if we're in a 'switch', it's a valid 'case' label; otherwise,
         *   it's misplaced 
         */
        if (enclosing_switch != 0)
        {
            /* parse the 'case' label */
            return parse_case(err, enclosing_switch);
        }
        else
        {
            /* 
             *   not directly within a 'switch', so this is a misplaced
             *   'case' keyword - log an error 
             */
            G_tok->log_error(TCERR_MISPLACED_CASE);
            
            /* skip the 'case' keyword */
            G_tok->next();
            
            /* assume there's an expression here, and skip that as well */
            parse_expr();
            
            /* if there's a colon, skip it, too */
            if (G_tok->cur() == TOKT_COLON)
                G_tok->next();
            
            /* proceed from here */
            return 0;
        }

    case TOKT_DEFAULT:
        /* allow this only if we're directly in a 'switch' body */
        if (enclosing_switch != 0)
        {
            /* parse the 'default' label */
            return parse_default(err, enclosing_switch);
        }
        else
        {
            /* misplaced 'default' keyword - log an error */
            G_tok->log_error(TCERR_MISPLACED_DEFAULT);
            
            /* skip the 'default' keyword; if there's a colon, skip it, too */
            if (G_tok->next() == TOKT_COLON)
                G_tok->next();

            /* proceed from here */
            return 0;
        }

    case TOKT_SYM:
        /*
         *   It's a symbol.  First, check for a label.  This requires that
         *   we look ahead one token, because we have to look at the next
         *   token to see if it's a colon; if it's not, we have to back up
         *   and parse the symbol as the start of an expression.  So,
         *   remember the current symbol token, then look at what follows.
         */
        tok = *G_tok->copycur();
        if (G_tok->next() == TOKT_COLON)
        {
            CTPNStmEnclosing *old_enclosing;
            CTPNStmLabel *label_stm;
            CTcSymLabel *lbl;
            CTPNStm *stm;

            /* it's a label - create a symbol table entry for it */
            lbl = add_code_label(&tok);

            /* create the labeled statement node */
            label_stm = new CTPNStmLabel(lbl, enclosing_stm_);

            /* skip the colon */
            G_tok->next();

            /* 
             *   set our new label to be the enclosing label for
             *   everything contained within its statement 
             */
            old_enclosing = set_enclosing_stm(label_stm);

            /* parse the labeled statement */
            stm = parse_stm(err, enclosing_switch, FALSE);

            /* restore our enclosing statement */
            set_enclosing_stm(old_enclosing);

            /* if parsing the labeled statement failed, give up */
            if (*err)
                return 0;

            /* connect to the label to the statement it labels */
            label_stm->set_stm(stm);

            /* point the label symbol to its statement node */
            if (lbl != 0)
                lbl->set_stm(label_stm);

            /* return the labeled statement node */
            return label_stm;
        }

        /* 
         *   it's not a label - push the colon back into the input stream
         *   so that we read it again, then parse this as an ordinary
         *   expression 
         */
        G_tok->unget();
        goto do_parse_expr;

    case TOKT_RPAR:
        /* 
         *   they probably had too many close parens in something like a
         *   'for' or 'if' statement - flag the error 
         */
        G_tok->log_error(TCERR_EXTRA_RPAR);

        /* skip the extra paren and go back for another try */
        G_tok->next();
        goto try_again;
        
    default:
    do_parse_expr:
        /* anything else must be the start of an expression */
        {
            /* parse the expression */
            CTcPrsNode *expr = parse_expr_or_dstr(TRUE);

            /* the statement must be terminated with a semicolon */
            if (parse_req_sem())
            {
                /* set the error flag */
                *err = TRUE;

                /* there's no statement to return */
                return 0;
            }
            
            /* 
             *   if we successfully parsed an expression, create a
             *   statement node for the expression; if expr is null, the
             *   expression parser will already have issued an error, so
             *   we can simply ignore the failed expression and continue
             *   to the next statement 
             */
            if (expr != 0)
                return new CTPNStmExpr(expr);
            else
                return 0;
        }
    }
}